

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O1

void __thiscall
glslang::TIntermOperator::crackTexture
          (TIntermOperator *this,TSampler sampler,TCrackedTextureOp *cracked)

{
  bool *pbVar1;
  bool *pbVar2;
  bool *pbVar3;
  TCrackedTextureOp *pTVar4;
  uint uVar5;
  
  cracked->subpass = false;
  cracked->lodClamp = false;
  cracked->fragMask = false;
  cracked->attachmentEXT = false;
  cracked->query = false;
  cracked->proj = false;
  cracked->lod = false;
  cracked->fetch = false;
  cracked->offset = false;
  cracked->offsets = false;
  cracked->gather = false;
  cracked->grad = false;
  if (0x50 < this->op - EOpImageQuerySize) {
    return;
  }
  pTVar4 = (TCrackedTextureOp *)&cracked->lod;
  pbVar1 = &cracked->offset;
  pbVar2 = &cracked->gather;
  pbVar3 = &cracked->grad;
  switch(this->op) {
  case EOpImageQuerySize:
  case EOpImageQuerySamples:
  case EOpTextureQuerySize:
  case EOpTextureQueryLod:
  case EOpTextureQueryLevels:
  case EOpTextureQuerySamples:
  case EOpSparseTexelsResident:
    goto switchD_00455948_caseD_1f0;
  default:
    goto switchD_00455948_caseD_1f2;
  case EOpImageLoadLod:
  case EOpImageStoreLod:
  case EOpSparseImageLoadLod:
  case EOpTextureLod:
  case EOpSparseTextureLod:
  case EOpImageSampleFootprintLodNV:
    break;
  case EOpSubpassLoad:
  case EOpSubpassLoadMS:
    pTVar4 = (TCrackedTextureOp *)&cracked->subpass;
    break;
  case EOpColorAttachmentReadEXT:
    cracked = (TCrackedTextureOp *)&cracked->attachmentEXT;
switchD_00455948_caseD_1f0:
    pTVar4 = cracked;
    break;
  case EOpTextureProj:
    goto switchD_00455948_caseD_20d;
  case EOpTextureOffset:
  case EOpSparseTextureOffset:
    goto switchD_00455948_caseD_20f;
  case EOpTextureFetch:
  case EOpSparseTextureFetch:
    cracked->fetch = true;
    goto LAB_004559af;
  case EOpTextureFetchOffset:
  case EOpSparseTextureFetchOffset:
    cracked->fetch = true;
    cracked->offset = true;
LAB_004559af:
    uVar5 = (uint)sampler & 0xff00;
    if ((uVar5 != 0x100) && (uVar5 != 0x300)) {
      if (uVar5 != 0x200) {
        return;
      }
      if (((uint)sampler >> 0x12 & 1) != 0) {
        return;
      }
    }
    break;
  case EOpTextureProjOffset:
    *pbVar1 = true;
    goto switchD_00455948_caseD_20d;
  case EOpTextureLodOffset:
  case EOpSparseTextureLodOffset:
    *pbVar1 = true;
    break;
  case EOpTextureProjLod:
    *(bool *)pTVar4 = true;
    goto switchD_00455948_caseD_20d;
  case EOpTextureProjLodOffset:
    *pbVar1 = true;
    *(bool *)pTVar4 = true;
    goto switchD_00455948_caseD_20d;
  case EOpTextureGrad:
  case EOpSparseTextureGrad:
  case EOpImageSampleFootprintGradNV:
    goto switchD_00455948_caseD_216;
  case EOpTextureGradOffset:
  case EOpSparseTextureGradOffset:
    *pbVar3 = true;
    goto switchD_00455948_caseD_20f;
  case EOpTextureProjGrad:
    *pbVar3 = true;
    goto switchD_00455948_caseD_20d;
  case EOpTextureProjGradOffset:
    *pbVar3 = true;
    *pbVar1 = true;
switchD_00455948_caseD_20d:
    pTVar4 = (TCrackedTextureOp *)&cracked->proj;
    break;
  case EOpTextureGather:
  case EOpSparseTextureGather:
    pTVar4 = (TCrackedTextureOp *)pbVar2;
    break;
  case EOpTextureGatherOffset:
  case EOpSparseTextureGatherOffset:
    *pbVar2 = true;
switchD_00455948_caseD_20f:
    pTVar4 = (TCrackedTextureOp *)pbVar1;
    break;
  case EOpTextureGatherOffsets:
  case EOpSparseTextureGatherOffsets:
    *pbVar2 = true;
    pTVar4 = (TCrackedTextureOp *)&cracked->offsets;
    break;
  case EOpTextureClamp:
  case EOpSparseTextureClamp:
  case EOpImageSampleFootprintClampNV:
    goto switchD_00455948_caseD_21d;
  case EOpTextureOffsetClamp:
  case EOpSparseTextureOffsetClamp:
    *pbVar1 = true;
    goto switchD_00455948_caseD_21d;
  case EOpTextureGradClamp:
  case EOpSparseTextureGradClamp:
    *pbVar3 = true;
    goto switchD_00455948_caseD_21d;
  case EOpTextureGradOffsetClamp:
  case EOpSparseTextureGradOffsetClamp:
    *pbVar3 = true;
    *pbVar1 = true;
switchD_00455948_caseD_21d:
    pTVar4 = (TCrackedTextureOp *)&cracked->lodClamp;
    break;
  case EOpTextureGatherLod:
  case EOpSparseTextureGatherLod:
    *pbVar2 = true;
    break;
  case EOpTextureGatherLodOffset:
  case EOpSparseTextureGatherLodOffset:
    *pbVar2 = true;
    *pbVar1 = true;
    break;
  case EOpTextureGatherLodOffsets:
  case EOpSparseTextureGatherLodOffsets:
    *pbVar2 = true;
    cracked->offsets = true;
    break;
  case EOpFragmentMaskFetch:
  case EOpFragmentFetch:
    cracked->subpass = ((uint)sampler & 0xff00) == 0x700;
    pTVar4 = (TCrackedTextureOp *)&cracked->fragMask;
    break;
  case EOpImageSampleFootprintGradClampNV:
    cracked->lodClamp = true;
switchD_00455948_caseD_216:
    pTVar4 = (TCrackedTextureOp *)pbVar3;
  }
  pTVar4->query = true;
switchD_00455948_caseD_1f2:
  return;
}

Assistant:

void crackTexture(TSampler sampler, TCrackedTextureOp& cracked) const
    {
        cracked.query = false;
        cracked.proj = false;
        cracked.lod = false;
        cracked.fetch = false;
        cracked.offset = false;
        cracked.offsets = false;
        cracked.gather = false;
        cracked.grad = false;
        cracked.subpass = false;
        cracked.attachmentEXT = false;
        cracked.lodClamp = false;
        cracked.fragMask = false;

        switch (op) {
        case EOpImageQuerySize:
        case EOpImageQuerySamples:
        case EOpTextureQuerySize:
        case EOpTextureQueryLod:
        case EOpTextureQueryLevels:
        case EOpTextureQuerySamples:
        case EOpSparseTexelsResident:
            cracked.query = true;
            break;
        case EOpTexture:
        case EOpSparseTexture:
            break;
        case EOpTextureProj:
            cracked.proj = true;
            break;
        case EOpTextureLod:
        case EOpSparseTextureLod:
            cracked.lod = true;
            break;
        case EOpTextureOffset:
        case EOpSparseTextureOffset:
            cracked.offset = true;
            break;
        case EOpTextureFetch:
        case EOpSparseTextureFetch:
            cracked.fetch = true;
            if (sampler.is1D() || (sampler.dim == Esd2D && ! sampler.isMultiSample()) || sampler.dim == Esd3D)
                cracked.lod = true;
            break;
        case EOpTextureFetchOffset:
        case EOpSparseTextureFetchOffset:
            cracked.fetch = true;
            cracked.offset = true;
            if (sampler.is1D() || (sampler.dim == Esd2D && ! sampler.isMultiSample()) || sampler.dim == Esd3D)
                cracked.lod = true;
            break;
        case EOpTextureProjOffset:
            cracked.offset = true;
            cracked.proj = true;
            break;
        case EOpTextureLodOffset:
        case EOpSparseTextureLodOffset:
            cracked.offset = true;
            cracked.lod = true;
            break;
        case EOpTextureProjLod:
            cracked.lod = true;
            cracked.proj = true;
            break;
        case EOpTextureProjLodOffset:
            cracked.offset = true;
            cracked.lod = true;
            cracked.proj = true;
            break;
        case EOpTextureGrad:
        case EOpSparseTextureGrad:
            cracked.grad = true;
            break;
        case EOpTextureGradOffset:
        case EOpSparseTextureGradOffset:
            cracked.grad = true;
            cracked.offset = true;
            break;
        case EOpTextureProjGrad:
            cracked.grad = true;
            cracked.proj = true;
            break;
        case EOpTextureProjGradOffset:
            cracked.grad = true;
            cracked.offset = true;
            cracked.proj = true;
            break;
        case EOpTextureClamp:
        case EOpSparseTextureClamp:
            cracked.lodClamp = true;
            break;
        case EOpTextureOffsetClamp:
        case EOpSparseTextureOffsetClamp:
            cracked.offset = true;
            cracked.lodClamp = true;
            break;
        case EOpTextureGradClamp:
        case EOpSparseTextureGradClamp:
            cracked.grad = true;
            cracked.lodClamp = true;
            break;
        case EOpTextureGradOffsetClamp:
        case EOpSparseTextureGradOffsetClamp:
            cracked.grad = true;
            cracked.offset = true;
            cracked.lodClamp = true;
            break;
        case EOpTextureGather:
        case EOpSparseTextureGather:
            cracked.gather = true;
            break;
        case EOpTextureGatherOffset:
        case EOpSparseTextureGatherOffset:
            cracked.gather = true;
            cracked.offset = true;
            break;
        case EOpTextureGatherOffsets:
        case EOpSparseTextureGatherOffsets:
            cracked.gather = true;
            cracked.offsets = true;
            break;
        case EOpTextureGatherLod:
        case EOpSparseTextureGatherLod:
            cracked.gather = true;
            cracked.lod    = true;
            break;
        case EOpTextureGatherLodOffset:
        case EOpSparseTextureGatherLodOffset:
            cracked.gather = true;
            cracked.offset = true;
            cracked.lod    = true;
            break;
        case EOpTextureGatherLodOffsets:
        case EOpSparseTextureGatherLodOffsets:
            cracked.gather  = true;
            cracked.offsets = true;
            cracked.lod     = true;
            break;
        case EOpImageLoadLod:
        case EOpImageStoreLod:
        case EOpSparseImageLoadLod:
            cracked.lod = true;
            break;
        case EOpFragmentMaskFetch:
            cracked.subpass = sampler.dim == EsdSubpass;
            cracked.fragMask = true;
            break;
        case EOpFragmentFetch:
            cracked.subpass = sampler.dim == EsdSubpass;
            cracked.fragMask = true;
            break;
        case EOpImageSampleFootprintNV:
            break;
        case EOpImageSampleFootprintClampNV:
            cracked.lodClamp = true;
            break;
        case EOpImageSampleFootprintLodNV:
            cracked.lod = true;
            break;
        case EOpImageSampleFootprintGradNV:
            cracked.grad = true;
            break;
        case EOpImageSampleFootprintGradClampNV:
            cracked.lodClamp = true;
            cracked.grad = true;
            break;
        case EOpSubpassLoad:
        case EOpSubpassLoadMS:
            cracked.subpass = true;
            break;
        case EOpColorAttachmentReadEXT:
            cracked.attachmentEXT = true;
            break;
        default:
            break;
        }
    }